

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseFunctionCall(Parser *this,FunctionMatch *match)

{
  SymbolList *pSVar1;
  pointer ptVar2;
  unsigned_long uVar3;
  mapped_type *this_00;
  Symbol *pSVar4;
  Symbol *pSVar5;
  SymbolListCItr endSymbol;
  ulong uVar6;
  String libName;
  String local_70;
  String local_50;
  RuntimeID local_30;
  
  if (match->signature == (FunctionSignature *)0x0) {
    __assert_fail("match.signature",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                  ,0x6c7,"void Jinx::Impl::Parser::ParseFunctionCall(const FunctionMatch &)");
  }
  CheckLibraryName_abi_cxx11_(&local_50,this);
  if (local_50._M_string_length != 0) {
    pSVar5 = (this->m_currentSymbol)._M_current;
    this->m_lastLine = pSVar5->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar5 + 1;
  }
  ptVar2 = (match->partData).
           super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((match->partData).
      super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ptVar2) {
    uVar6 = 0;
    do {
      if (ptVar2[uVar6].
          super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
          super__Head_base<0UL,_Jinx::Impl::FunctionSignaturePartType,_false>._M_head_impl == Name)
      {
        if (ptVar2[uVar6].
            super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
            super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl != 0) {
          pSVar5 = (this->m_currentSymbol)._M_current;
          this->m_lastLine = pSVar5->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar5 + 1;
        }
      }
      else {
        if (this->m_error == true) {
          pSVar5 = (this->m_currentSymbol)._M_current;
        }
        else {
          pSVar1 = this->m_symbolList;
          pSVar5 = (this->m_currentSymbol)._M_current;
          if ((pSVar5 != (pSVar1->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) && (pSVar5->type == ParenOpen)
             ) {
            this->m_lastLine = pSVar5->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar5 + 1;
            ParseExpression(this,(pSVar1->
                                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                 )._M_impl.super__Vector_impl_data._M_finish);
            Expect(this,ParenClose,"Error parsing expression");
            goto LAB_00124b52;
          }
        }
        uVar3 = ptVar2[uVar6].
                super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
                super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
        endSymbol._M_current = pSVar5;
        if (uVar3 != 0) {
          pSVar4 = pSVar5 + uVar3;
          do {
            endSymbol._M_current = pSVar5;
            if (pSVar5 == (this->m_symbolList->
                          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
            pSVar5 = pSVar5 + 1;
            uVar3 = uVar3 - 1;
            endSymbol._M_current = pSVar4;
          } while (uVar3 != 0);
        }
        ParseExpression(this,endSymbol);
      }
LAB_00124b52:
      uVar6 = uVar6 + 1;
      ptVar2 = (match->partData).
               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(match->partData).
                                    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar2 >> 3)
                            * -0x5555555555555555));
  }
  EmitOpcode(this,CallFunc);
  local_70._M_dataplus._M_p = (pointer)match->signature->m_id;
  Buffer::Write((this->m_writer).m_buffer.
                super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                &(this->m_writer).m_pos,&local_70,8);
  FunctionSignature::GetName_abi_cxx11_(&local_70,match->signature);
  local_30 = match->signature->m_id;
  this_00 = std::
            map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
            ::operator[](&this->m_idNameMap,&local_30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
            (this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    MemFree(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  ParseSubscriptGet(this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    MemFree(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseFunctionCall(const FunctionMatch & match)
	{
		assert(match.signature);

		auto libName = CheckLibraryName();
		if (!libName.empty())
			NextSymbol();

		// Parse function components according to match data
		for (size_t i = 0; i < match.partData.size(); ++i)
		{
			if (std::get<0>(match.partData[i]) == FunctionSignaturePartType::Name)
			{
				// Check to make sure this isn't a skipped optional name part
				if (std::get<1>(match.partData[i]) != 0)
					NextSymbol();
			}
			else
			{
				if (Accept(SymbolType::ParenOpen))
				{
					ParseExpression();
					Expect(SymbolType::ParenClose, "Error parsing expression");
				}
				else
				{
					auto expressionSize = std::get<1>(match.partData[i]);
					auto endSymbol = m_currentSymbol;
					for (size_t j = 0; j < expressionSize && endSymbol != m_symbolList.end(); ++j)
						++endSymbol;
					ParseExpression(endSymbol);
				}
			}
		}

		// When finished validating the function and pushing parameters, call the function
		EmitOpcode(Opcode::CallFunc);
		EmitId(match.signature->GetId());
		m_idNameMap[match.signature->GetId()] = match.signature->GetName();

		// Check for post-function index operator
		ParseSubscriptGet();
	}